

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_serializer.hpp
# Opt level: O0

void __thiscall
duckdb::BinarySerializer::BinarySerializer
          (BinarySerializer *this,WriteStream *stream,SerializationOptions *options_p)

{
  SerializationOptions *in_RDX;
  size_type in_RSI;
  Serializer *in_RDI;
  SerializationData *unaff_retaddr;
  SerializationOptions *in_stack_ffffffffffffffb8;
  
  Serializer::Serializer(in_RDI);
  in_RDI->_vptr_Serializer = (_func_int **)duckdb::ArrowArrayWrapper::~ArrowArrayWrapper;
  vector<duckdb::BinarySerializer::DebugState,_true>::vector
            ((vector<duckdb::BinarySerializer::DebugState,_true> *)0x6fbceb);
  in_RDI[1].options.serialization_compatibility.duckdb_version._M_string_length = in_RSI;
  SerializationData::SerializationData(unaff_retaddr);
  SerializationOptions::operator=(in_RDX,in_stack_ffffffffffffffb8);
  (in_RDI->options).serialize_enum_as_string = false;
  return;
}

Assistant:

explicit BinarySerializer(WriteStream &stream, SerializationOptions options_p = SerializationOptions())
	    : stream(stream) {
		options = std::move(options_p);
		// Override the value set by the passed in SerializationOptions
		options.serialize_enum_as_string = false;
	}